

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O3

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<22ul>
          (StringBuilder<Memory::ArenaAllocator> *this,char16 (*str) [22])

{
  if (this->length - this->count < 0x16) {
    ExtendBuffer(this,this->count + 0x16);
  }
  JavascriptString::CopyHelper(this->appendPtr,*str,0x15);
  this->appendPtr = this->appendPtr + 0x15;
  this->count = this->count + 0x15;
  return;
}

Assistant:

void AppendCppLiteral(const char16(&str)[N])
        {
            // Need to account for the terminating null character in C++ string literals, hence N > 2 and N - 1 below
            static_assert(N > 2, "Use Append(char16) for appending literal single characters and do not append empty string literal");
            Append(str, N - 1);
        }